

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalks
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,PolylineBuilder *this)

{
  btree_map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256> *this_00;
  int iVar1;
  pointer piVar2;
  pointer pvVar3;
  _Bit_type *p_Var4;
  pointer piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  EdgePolyline *polyline;
  pointer polyline_00;
  int iVar16;
  ulong uVar17;
  pointer piVar18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  VertexId v;
  EdgePolyline polyline_1;
  vector<int,_std::allocator<int>_> edges;
  int local_94;
  int *local_90;
  int local_84;
  pointer local_80;
  ulong local_78;
  EdgePolyline local_70;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &this->min_input_ids_;
  GetInputEdgeOrder(&local_58,(Graph *)this,local_40);
  piVar5 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this_00 = &this->excess_used_;
    piVar18 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    do {
      iVar10 = *piVar18;
      uVar8 = (ulong)iVar10;
      iVar16 = iVar10 + 0x3f;
      if (-1 < (long)uVar8) {
        iVar16 = iVar10;
      }
      if (((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p
           [(long)(iVar16 >> 6) +
            (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar8 & 0x3f) & 1) == 0) {
        local_94 = (this->g_->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar8].first;
        piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar10 = piVar2[local_94];
        iVar16 = piVar2[(long)local_94 + 1];
        if (this->directed_ == true) {
          piVar2 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          iVar16 = iVar16 + piVar2[local_94];
          uVar6 = iVar10 + piVar2[(long)local_94 + 1];
        }
        else {
          iVar16 = iVar16 - iVar10;
          uVar6 = iVar16 - (iVar16 >> 0x1f) & 0xfffffffe;
        }
        if (0 < (int)(iVar16 - uVar6)) {
          pmVar9 = gtl::internal_btree::
                   btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   ::operator[](&this_00->
                                 super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                ,&local_94);
          uVar6 = (iVar16 - uVar6) - *pmVar9;
          if (this->directed_ == true) {
            if (0 < (int)uVar6) {
LAB_001c1a90:
              pmVar9 = gtl::internal_btree::
                       btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       ::operator[](&this_00->
                                     super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                    ,&local_94);
              *pmVar9 = *pmVar9 + 1;
              BuildWalk(&local_70,this,local_94);
              std::
              vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              ::emplace_back<std::vector<int,std::allocator<int>>>
                        ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                          *)__return_storage_ptr__,&local_70);
              if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pmVar9 = gtl::internal_btree::
                       btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       ::operator[](&this_00->
                                     super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                    ,&(this->g_->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [(__return_storage_ptr__->
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish[-1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish[-1]].second);
              *pmVar9 = *pmVar9 + -1;
            }
          }
          else if ((uVar6 & 1) != 0) goto LAB_001c1a90;
        }
      }
      piVar18 = piVar18 + 1;
    } while (piVar18 != piVar5);
  }
  iVar10 = this->edges_left_;
  if (0 < iVar10) {
    polyline_00 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (polyline_00 != pvVar3) {
      do {
        MaximizeWalk(this,polyline_00);
        polyline_00 = polyline_00 + 1;
      } while (polyline_00 != pvVar3);
      iVar10 = this->edges_left_;
    }
    local_90 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (0 < iVar10 &&
        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != 0) {
      uVar8 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar17 = 0;
      local_78 = 0x800000000000003f;
      piVar15 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        iVar16 = local_90[uVar17];
        uVar13 = (ulong)iVar16;
        iVar14 = iVar16 + 0x3f;
        if (-1 < (long)uVar13) {
          iVar14 = iVar16;
        }
        p_Var4 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        if ((p_Var4[(long)(iVar14 >> 6) +
                    (ulong)((uVar13 & local_78) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar13 & 0x3f) & 1) == 0) {
          local_80 = (this->g_->edges_->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
          iVar16 = local_80[uVar13].first;
          if (uVar17 < uVar8) {
            piVar5 = (this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar14 = 0;
            uVar11 = uVar17;
            do {
              iVar1 = local_90[uVar11];
              uVar12 = (ulong)iVar1;
              if (piVar5[uVar12] != piVar5[uVar13]) break;
              iVar7 = iVar1 + 0x3f;
              if (-1 < iVar1) {
                iVar7 = iVar1;
              }
              if ((p_Var4[(long)(iVar7 >> 6) +
                          (ulong)((uVar12 & local_78) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   (uVar12 & 0x3f) & 1) == 0) {
                iVar14 = (iVar14 + (uint)(local_80[uVar12].first == iVar16)) -
                         (uint)(local_80[uVar12].second == iVar16);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < uVar8);
            local_84 = iVar10;
            if (iVar14 != 1) goto LAB_001c1c90;
          }
          else {
LAB_001c1c90:
            if (local_80[uVar13].second != iVar16) goto LAB_001c1ce4;
          }
          BuildWalk(&local_70,this,iVar16);
          MaximizeWalk(this,&local_70);
          std::
          vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
          ::emplace_back<std::vector<int,std::allocator<int>>>
                    ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                      *)__return_storage_ptr__,&local_70);
          if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          local_90 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          iVar10 = this->edges_left_;
          piVar15 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
LAB_001c1ce4:
        uVar17 = uVar17 + 1;
        uVar8 = (long)piVar15 - (long)local_90 >> 2;
      } while ((uVar17 < uVar8) && (0 < iVar10));
    }
  }
  if (iVar10 != 0) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
               ,0x30b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,"Check failed: (0) == (edges_left_) ",0x23);
    abort();
  }
  CanonicalizeVectorOrder(local_40,__return_storage_ptr__);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgePolyline> Graph::PolylineBuilder::BuildWalks() {
  // Note that some of this code is worst-case quadratic in the maximum vertex
  // degree.  This could be fixed with a few extra arrays, but it should not
  // be a problem in practice.

  // First, build polylines from all vertices where outdegree > indegree (or
  // for undirected edges, vertices whose degree is odd).  We consider the
  // possible starting edges in input edge id order, for idempotency in the
  // case where multiple input polylines share vertices or edges.
  vector<EdgePolyline> polylines;
  vector<EdgeId> edges = g_.GetInputEdgeOrder(min_input_ids_);
  for (EdgeId e : edges) {
    if (used_[e]) continue;
    VertexId v = g_.edge(e).first;
    int excess = excess_degree(v);
    if (excess <= 0) continue;
    excess -= excess_used_[v];
    if (directed_ ? (excess <= 0) : (excess % 2 == 0)) continue;
    ++excess_used_[v];
    polylines.push_back(BuildWalk(v));
    --excess_used_[g_.edge(polylines.back().back()).second];
  }
  // Now all vertices have outdegree == indegree (or even degree if undirected
  // edges are being used).  Therefore all remaining edges can be assembled
  // into loops.  We first try to expand the existing polylines if possible by
  // adding loops to them.
  if (edges_left_ > 0) {
    for (EdgePolyline& polyline : polylines) {
      MaximizeWalk(&polyline);
    }
  }
  // Finally, if there are still unused edges then we build loops.  If the
  // input is a polyline that forms a loop, then for idempotency we need to
  // start from the edge with minimum input edge id.  If the minimal input
  // edge was split into several edges, then we start from the first edge of
  // the chain.
  for (int i = 0; i < edges.size() && edges_left_ > 0; ++i) {
    EdgeId e = edges[i];
    if (used_[e]) continue;

    // Determine whether the origin of this edge is the start of an edge
    // chain.  To do this, we test whether (outdegree - indegree == 1) for the
    // origin, considering only unused edges with the same minimum input edge
    // id.  (Undirected edges have input edge ids in one direction only.)
    VertexId v = g_.edge(e).first;
    InputEdgeId id = min_input_ids_[e];
    int excess = 0;
    for (int j = i; j < edges.size() && min_input_ids_[edges[j]] == id; ++j) {
      EdgeId e2 = edges[j];
      if (used_[e2]) continue;
      if (g_.edge(e2).first == v) ++excess;
      if (g_.edge(e2).second == v) --excess;
    }
    // It is also acceptable to start a polyline from any degenerate edge.
    if (excess == 1 || g_.edge(e).second == v) {
      EdgePolyline polyline = BuildWalk(v);
      MaximizeWalk(&polyline);
      polylines.push_back(std::move(polyline));
    }
  }
  S2_DCHECK_EQ(0, edges_left_);

  // Sort the polylines to correspond to the input order (if possible).
  CanonicalizeVectorOrder(min_input_ids_, &polylines);
  return polylines;
}